

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O1

SelectionVectorHelper * __thiscall
duckdb::ReservoirSample::GetReplacementIndexesFast
          (SelectionVectorHelper *__return_storage_ptr__,ReservoirSample *this,
          idx_t sample_chunk_offset,idx_t chunk_length)

{
  idx_t iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __buckets_ptr pp_Var3;
  size_type sVar4;
  __node_base _Var5;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  uint32_t size;
  pointer pBVar8;
  long lVar9;
  reference pvVar10;
  ulong count;
  idx_t i;
  size_type __n;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  SelectionVector chunk_sel;
  vector<unsigned_int,_true> random_sel_indexes;
  vector<unsigned_int,_true> random_indexes_chunk;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  replacement_indexes;
  SelectionVector local_e0;
  vector<unsigned_int,_true> local_c8;
  vector<unsigned_int,_true> local_b0;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_98;
  double local_58;
  double dStack_50;
  undefined8 local_48;
  shared_ptr<duckdb::SelectionData,_true> local_40;
  
  auVar12._8_4_ = (int)(chunk_length >> 0x20);
  auVar12._0_8_ = chunk_length;
  auVar12._12_4_ = 0x45300000;
  dStack_50 = auVar12._8_8_ - 1.9342813113834067e+25;
  local_58 = dStack_50 + ((double)CONCAT44(0x43300000,(uint32_t)chunk_length) - 4503599627370496.0);
  pBVar8 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(&(this->super_BlockingSample).base_reservoir_sample);
  lVar9 = pBVar8->num_entries_seen_total + chunk_length;
  auVar13._8_4_ = (int)((ulong)lVar9 >> 0x20);
  auVar13._0_8_ = lVar9;
  auVar13._12_4_ = 0x45300000;
  iVar1 = this->sample_count;
  auVar14._8_4_ = (int)(iVar1 >> 0x20);
  auVar14._0_8_ = iVar1;
  auVar14._12_4_ = 0x45300000;
  dVar11 = round(((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0)) *
                 (local_58 /
                 ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0))));
  (__return_storage_ptr__->sel).sel_vector = (sel_t *)0x0;
  (__return_storage_ptr__->sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (__return_storage_ptr__->sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  size = (uint32_t)(long)dVar11;
  if (size == 0) {
    SelectionVector::SelectionVector((SelectionVector *)&local_98,0);
    _Var5._M_nxt = local_98._M_before_begin._M_nxt;
    sVar4 = local_98._M_bucket_count;
    pp_Var3 = local_98._M_buckets;
    local_98._M_buckets = (__buckets_ptr)0x0;
    local_98._M_bucket_count = 0;
    local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->sel).sel_vector = (sel_t *)pp_Var3;
    (__return_storage_ptr__->sel).selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sVar4;
    p_Var2 = (__return_storage_ptr__->sel).selection_data.internal.
             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (__return_storage_ptr__->sel).selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_nxt;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_before_begin._M_nxt !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_before_begin._M_nxt);
    }
    __return_storage_ptr__->size = 0;
  }
  else {
    count = (long)dVar11 & 0xffffffff;
    local_98._M_buckets = &local_98._M_single_bucket;
    local_98._M_bucket_count = (size_type)&DAT_00000001;
    local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_98._M_element_count = 0;
    local_98._M_rehash_policy._M_max_load_factor = 1.0;
    local_98._M_rehash_policy._M_next_resize = 0;
    local_98._M_single_bucket = (__node_base_ptr)0x0;
    SelectionVector::SelectionVector(&local_e0,count);
    GetRandomizedVector(&local_b0,this,(uint32_t)chunk_length,size);
    GetRandomizedVector(&local_c8,this,(uint32_t)this->sel_size,size);
    __n = 0;
    do {
      pvVar10 = vector<unsigned_int,_true>::operator[](&local_b0,__n);
      local_e0.sel_vector[__n] = *pvVar10;
      pvVar10 = vector<unsigned_int,_true>::operator[](&local_c8,__n);
      (this->sel).sel_vector[*pvVar10] = (int)sample_chunk_offset + (int)__n;
      __n = __n + 1;
    } while (count != __n);
    local_40.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_40.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    shared_ptr<duckdb::SelectionData,_true>::operator=(&local_40,&local_e0.selection_data);
    _Var7._M_pi = local_40.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    peVar6 = local_40.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (__return_storage_ptr__->sel).sel_vector = local_e0.sel_vector;
    local_48 = 0;
    local_40.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_40.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (__return_storage_ptr__->sel).selection_data.internal.
             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (__return_storage_ptr__->sel).selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
    (__return_storage_ptr__->sel).selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var7._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (local_40.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    __return_storage_ptr__->size = size;
    if (local_c8.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_b0.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_e0.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

SelectionVectorHelper ReservoirSample::GetReplacementIndexesFast(idx_t sample_chunk_offset, idx_t chunk_length) {

	// how much weight to the other tuples have compared to the ones in this chunk?
	auto weight_tuples_other = static_cast<double>(chunk_length) / static_cast<double>(GetTuplesSeen() + chunk_length);
	auto num_to_pop = static_cast<uint32_t>(round(weight_tuples_other * static_cast<double>(sample_count)));
	D_ASSERT(num_to_pop <= sample_count);
	D_ASSERT(num_to_pop <= sel_size);
	SelectionVectorHelper ret;

	if (num_to_pop == 0) {
		ret.sel = SelectionVector(num_to_pop);
		ret.size = 0;
		return ret;
	}
	std::unordered_map<idx_t, idx_t> replacement_indexes;
	SelectionVector chunk_sel(num_to_pop);

	auto random_indexes_chunk = GetRandomizedVector(static_cast<uint32_t>(chunk_length), num_to_pop);
	auto random_sel_indexes = GetRandomizedVector(static_cast<uint32_t>(sel_size), num_to_pop);
	for (idx_t i = 0; i < num_to_pop; i++) {
		// update the selection vector for the reservoir sample
		chunk_sel.set_index(i, random_indexes_chunk[i]);
		// sel is not guaratneed to be random, so we update the indexes according to our
		// random sel indexes.
		sel.set_index(random_sel_indexes[i], sample_chunk_offset + i);
	}

	D_ASSERT(sel_size == sample_count);

	ret.sel = SelectionVector(chunk_sel);
	ret.size = num_to_pop;
	return ret;
}